

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

pane_t * next_pane(pane_type_t type,buffer_t *buffer,int width,int height)

{
  int height_local;
  int width_local;
  buffer_t *buffer_local;
  pane_t *ppStack_10;
  pane_type_t type_local;
  
  if (type == PANE_HEX) {
    ppStack_10 = text_post(buffer,width,height);
  }
  else if (type == PANE_TEXT) {
    ppStack_10 = hex_post(buffer,width,height);
  }
  return ppStack_10;
}

Assistant:

static pane_t*
next_pane(pane_type_t type, buffer_t *buffer, int width, int height)
{
    if (type == PANE_HEX) {
        return text_post(buffer, width, height);
    } else if (type == PANE_TEXT) {
        return hex_post(buffer, width, height);
    } else {
        __builtin_unreachable();
    }
}